

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newmem.c
# Opt level: O2

void free_pstring(char *pstr)

{
  if (pstr == str_empty || pstr == (char *)0x0) {
    return;
  }
  nAllocString = nAllocString + -1;
  operator_delete__(pstr);
  return;
}

Assistant:

void free_pstring(char *pstr)
{
//	RS.Logger.Info("Trying to free {} : {}.",pstr,(long)pstr);
//	if(pstr == nullptr)
//		RS.Logger.Debug("Error: Trying to free null pstring.");
	if(pstr == nullptr 
         ||   pstr == &str_empty[0]) 
                return;
	nAllocString--;
//	sAllocString -= strlen(pstr);
	delete[] pstr;
}